

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int send_data_blocked(quicly_conn_t *conn,quicly_send_context_t *s)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint8_t *puVar3;
  int iVar4;
  uint8_t *puVar5;
  quicly_sent_t *sent;
  quicly_sent_t *local_30;
  uint8_t *local_28;
  
  uVar2 = (conn->egress).max_data.permitted;
  iVar4 = allocate_ack_eliciting_frame(conn,s,9,&local_30,on_ack_data_blocked);
  if (iVar4 == 0) {
    (local_30->data).packet.packet_number = uVar2;
    puVar3 = s->dst;
    *puVar3 = '\x14';
    puVar5 = puVar3 + 1;
    if (0x3f < uVar2) {
      if (uVar2 < 0x4000) {
        puVar3[1] = (byte)(uVar2 >> 8) | 0x40;
        puVar5 = puVar3 + 2;
      }
      else {
        send_data_blocked_cold_1();
        puVar5 = local_28;
      }
    }
    *puVar5 = (uint8_t)uVar2;
    s->dst = puVar5 + 1;
    (conn->egress).data_blocked = QUICLY_SENDER_STATE_UNACKED;
    puVar1 = &(conn->super).stats.num_frames_sent.data_blocked;
    *puVar1 = *puVar1 + 1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int send_data_blocked(quicly_conn_t *conn, quicly_send_context_t *s)
{
    quicly_sent_t *sent;
    int ret;

    uint64_t offset = conn->egress.max_data.permitted;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_DATA_BLOCKED_FRAME_CAPACITY, &sent, on_ack_data_blocked)) != 0)
        goto Exit;
    sent->data.data_blocked.offset = offset;
    s->dst = quicly_encode_data_blocked_frame(s->dst, offset);
    conn->egress.data_blocked = QUICLY_SENDER_STATE_UNACKED;

    ++conn->super.stats.num_frames_sent.data_blocked;
    QUICLY_PROBE(DATA_BLOCKED_SEND, conn, conn->stash.now, offset);

    ret = 0;
Exit:
    return ret;
}